

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void Curl_http_exp100_got100(Curl_easy *data)

{
  Curl_creader *reader;
  Curl_creader *r;
  Curl_easy *data_local;
  
  reader = Curl_creader_get_by_type(data,&cr_exp100);
  if (reader != (Curl_creader *)0x0) {
    http_exp100_continue(data,reader);
  }
  return;
}

Assistant:

void Curl_http_exp100_got100(struct Curl_easy *data)
{
  struct Curl_creader *r = Curl_creader_get_by_type(data, &cr_exp100);
  if(r)
    http_exp100_continue(data, r);
}